

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void serialize_combined(char *serialized_model,char *serialized_model_ext,char *serialized_imputer,
                       char *serialized_indexer,char *optional_metadata,
                       size_t size_optional_metadata,FILE *out)

{
  serialize_combined<_IO_FILE*>
            (serialized_model,serialized_model_ext,serialized_imputer,serialized_indexer,
             optional_metadata,size_optional_metadata,&out);
  return;
}

Assistant:

void serialize_combined
(
    const char *serialized_model,
    const char *serialized_model_ext,
    const char *serialized_imputer,
    const char *serialized_indexer,
    const char *optional_metadata,
    const size_t size_optional_metadata,
    FILE *out
)
{
    serialize_combined<FILE*>(
        serialized_model,
        serialized_model_ext,
        serialized_imputer,
        serialized_indexer,
        optional_metadata,
        size_optional_metadata,
        out
    );
}